

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O0

int ifr_count_tiles(igsc_device_handle *handle)

{
  uint uVar1;
  long in_FS_OFFSET;
  uint local_28;
  uint retries;
  int ret;
  igsc_device_handle *handle_local;
  long lStack_10;
  uint16_t supported_tiles;
  
  lStack_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  do {
    uVar1 = igsc_ifr_count_tiles(handle,(long)&handle_local + 6);
    if (uVar1 != 0xd) break;
    gsc_msleep(2000);
    local_28 = local_28 + 1;
  } while (local_28 < 3);
  if (uVar1 == 0) {
    printf("Number of supported tiles: %u\n",(ulong)handle_local._6_2_);
    handle_local._0_4_ = 0;
  }
  else {
    if ((quiet & 1U) == 0) {
      fprintf(_stderr,"Error: Failed to run ifr count tiles, library return code %d\n",(ulong)uVar1)
      ;
    }
    print_device_fw_status(handle);
    handle_local._0_4_ = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_10) {
    __stack_chk_fail();
  }
  return (int)handle_local;
}

Assistant:

mockable_static
int ifr_count_tiles(struct igsc_device_handle *handle)
{
    int ret;
    uint16_t supported_tiles;
    unsigned int retries = 0;

    /* call the igsc library routine to run ifr count tiles */
    while ((ret = igsc_ifr_count_tiles(handle, &supported_tiles)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }
    if (ret)
    {
        fwupd_error("Failed to run ifr count tiles, library return code %d\n", ret);
        print_device_fw_status(handle);
        return EXIT_FAILURE;
    }

    printf("Number of supported tiles: %u\n", supported_tiles);

    return ret;
}